

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_WriteBooth(FILE *pFile,int nVars)

{
  uint n;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = Abc_Base10Log(nVars);
  n = nVars * 2;
  uVar2 = Abc_Base10Log(n);
  uVar6 = (ulong)uVar2;
  if (0 < nVars) {
    fprintf((FILE *)pFile,".model Multi%d\n",(ulong)(uint)nVars);
    fwrite(".inputs",7,1,(FILE *)pFile);
    for (uVar3 = 0; nVars != uVar3; uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile," a%0*d",(ulong)uVar1,(ulong)uVar3);
    }
    for (uVar3 = 0; nVars != uVar3; uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile," b%0*d",(ulong)uVar1,(ulong)uVar3);
    }
    fputc(10,(FILE *)pFile);
    fwrite(".outputs",8,1,(FILE *)pFile);
    for (uVar3 = 0; n != uVar3; uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile," m%0*d",uVar6,(ulong)uVar3);
    }
    fputc(10,(FILE *)pFile);
    Abc_WriteBoothPartialProducts(pFile,nVars);
    for (uVar3 = 0; n != uVar3; uVar3 = uVar3 + 1) {
      fprintf((FILE *)pFile,".names x%0*d_%0*d\n",(ulong)uVar1,0,uVar6,(ulong)uVar3);
    }
    uVar5 = (nVars + 1) / 2 + 1;
    uVar3 = 0;
    while (uVar3 != uVar5) {
      fprintf((FILE *)pFile,".subckt ADD%d",(ulong)n);
      for (uVar4 = 0; n != (uint)uVar4; uVar4 = (ulong)((uint)uVar4 + 1)) {
        fprintf((FILE *)pFile," a%0*d=x%0*d_%0*d",(ulong)uVar2,uVar4,(ulong)uVar1,(ulong)uVar3,uVar6
                ,uVar4);
      }
      for (uVar4 = 0; n != (uint)uVar4; uVar4 = (ulong)((uint)uVar4 + 1)) {
        fprintf((FILE *)pFile," b%0*d=y%0*d_%0*d",(ulong)uVar2,uVar4,(ulong)uVar1,(ulong)uVar3,uVar6
                ,uVar4);
      }
      uVar3 = uVar3 + 1;
      for (uVar4 = 0; n + 1 != (int)uVar4; uVar4 = (ulong)((int)uVar4 + 1)) {
        fprintf((FILE *)pFile," s%0*d=x%0*d_%0*d",(ulong)uVar2,uVar4,(ulong)uVar1,(ulong)uVar3,uVar6
                ,uVar4);
      }
      fputc(10,(FILE *)pFile);
    }
    for (uVar4 = 0; n != (uint)uVar4; uVar4 = (ulong)((uint)uVar4 + 1)) {
      fprintf((FILE *)pFile,".names x%0*d_%0*d m%0*d\n1 1\n",(ulong)uVar1,(ulong)uVar5,(ulong)uVar2,
              uVar4,uVar6,uVar4);
    }
    fwrite(".end\n",5,1,(FILE *)pFile);
    fputc(10,(FILE *)pFile);
    Abc_WriteAdder(pFile,n);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                ,0x448,"void Abc_WriteBooth(FILE *, int)");
}

Assistant:

void Abc_WriteBooth( FILE * pFile, int nVars )
{
    int i, k, nDigits = Abc_Base10Log( nVars ), nDigits2 = Abc_Base10Log( 2*nVars );
    int Length = 1+(nVars + 1)/2;

    assert( nVars > 0 );
    fprintf( pFile, ".model Multi%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, " m%0*d", nDigits2, i );
    fprintf( pFile, "\n" );

    Abc_WriteBoothPartialProducts( pFile, nVars );

    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d\n", nDigits, 0, nDigits2, i );
    for ( k = 0; k < Length; k++ )
    {
        fprintf( pFile, ".subckt ADD%d", 2*nVars );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " a%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " b%0*d=y%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i <= 2*nVars; i++ )
            fprintf( pFile, " s%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k+1, nDigits2, i );
        fprintf( pFile, "\n" );
    }
    for ( i = 0; i < 2 * nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d m%0*d\n1 1\n", nDigits, k, nDigits2, i, nDigits2, i );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteAdder( pFile, 2*nVars );
}